

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O3

CURLcode Curl_headers_push(Curl_easy *data,char *header,uchar type)

{
  char cVar1;
  uchar uVar2;
  char *pcVar3;
  size_t sVar4;
  Curl_header_store *ne;
  Curl_header_store *pCVar5;
  char *pcVar6;
  char *pcVar7;
  uchar *puVar8;
  char cVar9;
  ulong __n;
  
  cVar9 = *header;
  if (cVar9 == '\n') {
    return CURLE_OK;
  }
  if (cVar9 == '\r') {
    return CURLE_OK;
  }
  pcVar3 = strchr(header,0xd);
  if ((pcVar3 == (char *)0x0) && (pcVar3 = strchr(header,10), pcVar3 == (char *)0x0)) {
    return CURLE_WEIRD_SERVER_REPLY;
  }
  __n = (long)pcVar3 - (long)header;
  if ((cVar9 == ' ') || (cVar9 == '\t')) {
    pCVar5 = (data->state).prevhead;
    if (pCVar5 != (Curl_header_store *)0x0) {
      pcVar3 = pCVar5->value;
      sVar4 = strlen(pcVar3);
      for (; __n != 0; __n = __n - 1) {
        cVar1 = header[__n - 1];
        if (((cVar1 != '\t') && (cVar1 != ' ')) && (3 < (byte)(cVar1 - 10U))) {
          if (1 < __n) {
            pcVar7 = header + (__n - 1);
            goto LAB_0012f4f0;
          }
          __n = 1;
          goto LAB_0012f34c;
        }
      }
      __n = 0;
      goto LAB_0012f34c;
    }
    while( true ) {
      if (__n == 0) {
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if ((*header != ' ') && (*header != '\t')) break;
      header = header + 1;
      __n = __n - 1;
    }
  }
  pCVar5 = (Curl_header_store *)(*Curl_ccalloc)(1,__n + 0x38);
  if (pCVar5 == (Curl_header_store *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar3 = pCVar5->buffer;
  memcpy(pcVar3,header,__n);
  pCVar5->buffer[__n] = '\0';
  pcVar7 = pcVar3;
  if (type == '\x10') {
    if (*pcVar3 != ':') goto LAB_0012f4c5;
    pcVar7 = &pCVar5->field_0x36;
  }
  puVar8 = (uchar *)(pCVar5->buffer + __n);
  while( true ) {
    pcVar6 = pcVar7;
    pcVar7 = pcVar6 + 1;
    if (*pcVar6 == '\0') break;
    if (*pcVar6 == ':') {
      *pcVar6 = '\0';
      for (; (*pcVar7 == ' ' || (*pcVar7 == '\t')); pcVar7 = pcVar7 + 1) {
      }
      while ((puVar8 = puVar8 + -1, pcVar7 < puVar8 &&
             (((uVar2 = *puVar8, uVar2 == '\t' || (uVar2 == ' ')) || ((byte)(uVar2 - 10) < 4))))) {
        *puVar8 = '\0';
      }
      pCVar5->name = pcVar3;
      pCVar5->value = pcVar7;
      pCVar5->type = type;
      pCVar5->request = (data->state).requests;
      Curl_llist_append(&(data->state).httphdrs,pCVar5,(Curl_llist_node *)pCVar5);
      (data->state).prevhead = pCVar5;
      return CURLE_OK;
    }
  }
LAB_0012f4c5:
  (*Curl_cfree)(pCVar5);
  return CURLE_BAD_FUNCTION_ARGUMENT;
  while( true ) {
    header = header + 1;
    __n = __n - 1;
    if (__n < 2) break;
LAB_0012f4f0:
    if (((cVar9 != ' ') && (cVar9 != '\t')) ||
       ((cVar9 = header[1], cVar9 != ' ' && (cVar9 != '\t')))) goto LAB_0012f34c;
  }
  __n = 1;
  header = pcVar7;
LAB_0012f34c:
  Curl_node_remove(&pCVar5->node);
  ne = (Curl_header_store *)
       Curl_saferealloc(pCVar5,(size_t)(pcVar3 + __n + sVar4 + -(long)pCVar5 + 5));
  if (ne == (Curl_header_store *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  ne->name = ne->buffer;
  ne->value = pcVar3 + -(long)pCVar5 + (long)(ne->buffer + -0x35);
  memcpy(pcVar3 + -(long)pCVar5 + (long)(ne->buffer + -0x35) + sVar4,header,__n);
  ne->value[__n + sVar4] = '\0';
  Curl_llist_append(&(data->state).httphdrs,ne,(Curl_llist_node *)ne);
  (data->state).prevhead = ne;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_headers_push(struct Curl_easy *data, const char *header,
                           unsigned char type)
{
  char *value = NULL;
  char *name = NULL;
  char *end;
  size_t hlen; /* length of the incoming header */
  struct Curl_header_store *hs;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  if((header[0] == '\r') || (header[0] == '\n'))
    /* ignore the body separator */
    return CURLE_OK;

  end = strchr(header, '\r');
  if(!end) {
    end = strchr(header, '\n');
    if(!end)
      /* neither CR nor LF as terminator is not a valid header */
      return CURLE_WEIRD_SERVER_REPLY;
  }
  hlen = end - header;

  if((header[0] == ' ') || (header[0] == '\t')) {
    if(data->state.prevhead)
      /* line folding, append value to the previous header's value */
      return unfold_value(data, header, hlen);
    else {
      /* cannot unfold without a previous header. Instead of erroring, just
         pass the leading blanks. */
      while(hlen && ISBLANK(*header)) {
        header++;
        hlen--;
      }
      if(!hlen)
        return CURLE_WEIRD_SERVER_REPLY;
    }
  }

  hs = calloc(1, sizeof(*hs) + hlen);
  if(!hs)
    return CURLE_OUT_OF_MEMORY;
  memcpy(hs->buffer, header, hlen);
  hs->buffer[hlen] = 0; /* nul terminate */

  result = namevalue(hs->buffer, hlen, type, &name, &value);
  if(!result) {
    hs->name = name;
    hs->value = value;
    hs->type = type;
    hs->request = data->state.requests;

    /* insert this node into the list of headers */
    Curl_llist_append(&data->state.httphdrs, hs, &hs->node);
    data->state.prevhead = hs;
  }
  else
    free(hs);
  return result;
}